

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

void __thiscall storage::BTree::print(BTree *this)

{
  BTNode *this_00;
  uint uVar1;
  int iVar2;
  size_type sVar3;
  reference ppBVar4;
  long local_f0;
  BTNode *local_c0;
  int local_8c;
  int local_88;
  int i_2;
  int i_1;
  int i;
  BTInnerNode *nd;
  BTNode *node;
  undefined1 local_60 [8];
  queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_> queue
  ;
  BTree *this_local;
  
  queue.c.super__Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::queue<storage::BTNode*,std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>>::
  queue<std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>,void>
            ((queue<storage::BTNode*,std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>>
              *)local_60);
  if (this->root_ != (BTNode *)0x0) {
    std::
    queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>::
    push((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
          *)local_60,&this->root_);
  }
  while( true ) {
    while( true ) {
      sVar3 = std::
              queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
              ::size((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
                      *)local_60);
      if (sVar3 == 0) {
        std::
        queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
        ::~queue((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
                  *)local_60);
        return;
      }
      ppBVar4 = std::
                queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
                ::front((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
                         *)local_60);
      this_00 = *ppBVar4;
      std::
      queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>::
      pop((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
           *)local_60);
      uVar1 = (**this_00->_vptr_BTNode)();
      if ((uVar1 & 1) == 0) break;
      printf("(");
      for (local_8c = 0; iVar2 = BTNode::key_count(this_00), local_8c < iVar2;
          local_8c = local_8c + 1) {
        iVar2 = BTNode::key_count(this_00);
        if (local_8c == iVar2 + -1) {
          printf("%d",(ulong)(uint)this_00->keys_[local_8c]);
        }
        else {
          printf("%d,",(ulong)(uint)this_00->keys_[local_8c]);
        }
      }
      printf(")");
      if (this_00 == (BTNode *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0 = __dynamic_cast(this_00,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      }
      if (*(long *)(local_f0 + 0x270) != 0) {
        printf("->");
      }
    }
    if (this_00 == (BTNode *)0x0) {
      local_c0 = (BTNode *)0x0;
    }
    else {
      local_c0 = (BTNode *)__dynamic_cast(this_00,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
    }
    if (local_c0 == (BTNode *)0x0) break;
    printf("[");
    for (i_2 = 0; iVar2 = BTNode::key_count(local_c0), i_2 < iVar2; i_2 = i_2 + 1) {
      iVar2 = BTNode::key_count(local_c0);
      if (i_2 == iVar2 + -1) {
        printf("%d",(ulong)(uint)local_c0->keys_[i_2]);
      }
      else {
        printf("%d,",(ulong)(uint)local_c0->keys_[i_2]);
      }
    }
    printf("]");
    for (local_88 = 0; local_88 < local_c0->used_links_count_; local_88 = local_88 + 1) {
      std::
      queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>::
      push((queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_>
            *)local_60,(value_type *)(local_c0[1].keys_ + (long)local_88 * 2 + -5));
    }
    if ((local_c0->parent_ == (BTNode *)0x0) ||
       (local_c0->child_index_ == local_c0->parent_->used_links_count_ + -1)) {
      printf("\n");
    }
  }
  __assert_fail("nd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x133,"void storage::BTree::print()");
}

Assistant:

void BTree::print() {
        std::queue<BTNode*> queue;
        if (root_)
            queue.push(root_);
        while (queue.size() > 0)
        {
            BTNode* node = queue.front();
            queue.pop();
            if (!node->is_leaf_node())
            {
                auto nd = dynamic_cast<BTInnerNode*>(node);
                assert(nd);
                printf("[");
                for (int i = 0; i < nd->key_count(); ++i)
                {
                    if (i == nd->key_count() - 1)
                    {
                        printf("%d", nd->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", nd->keys_[i]);
                    }
                }
                printf("]");
                for (int i = 0; i < nd->used_links_count_; ++i)
                    queue.push(nd->links_[i]);
                if (!nd->parent_ || nd->child_index_ == nd->parent_->used_links_count_ - 1)
                {
                    printf("\n");
                }
            }
            else
            {
                printf("(");
                for (int i = 0; i < node->key_count(); ++i)
                {
                    if (i == node->key_count() - 1)
                    {
                        printf("%d", node->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", node->keys_[i]);
                    }
                }
                printf(")");
                if (dynamic_cast<BTLeafNode*>(node)->next_)
                    printf("->");
            }
        }
    }